

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void __thiscall tcmalloc::SizeMap::Init(SizeMap *this)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem b_03;
  LogItem b_04;
  LogItem b_05;
  LogItem b_06;
  LogItem b_07;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem c_03;
  LogItem c_04;
  LogItem c_05;
  LogItem c_06;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  LogItem d_03;
  LogItem d_04;
  LogItem d_05;
  LogItem d_06;
  LogItem d_07;
  undefined1 auVar6 [16];
  uchar uVar7;
  int log;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  anon_union_8_4_e5b1a622_for_u_ aVar13;
  uint uVar14;
  int i;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  anon_union_8_4_e5b1a622_for_u_ aVar20;
  ulong uVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar82;
  int iVar83;
  undefined1 auVar81 [16];
  int iVar84;
  undefined4 uStack_1ac;
  anon_union_8_4_e5b1a622_for_u_ aStack_1a8;
  undefined4 uStack_19c;
  anon_union_8_4_e5b1a622_for_u_ aStack_198;
  undefined4 uStack_18c;
  anon_union_8_4_e5b1a622_for_u_ aStack_188;
  undefined4 uStack_17c;
  anon_union_8_4_e5b1a622_for_u_ aStack_178;
  undefined4 uStack_16c;
  anon_union_8_4_e5b1a622_for_u_ aStack_168;
  undefined4 uStack_15c;
  anon_union_8_4_e5b1a622_for_u_ aStack_158;
  undefined4 uStack_14c;
  anon_union_8_4_e5b1a622_for_u_ aStack_148;
  undefined4 uStack_13c;
  anon_union_8_4_e5b1a622_for_u_ aStack_138;
  undefined4 uStack_12c;
  anon_union_8_4_e5b1a622_for_u_ aStack_128;
  undefined4 uStack_11c;
  undefined4 uStack_10c;
  undefined4 uStack_fc;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  anon_union_8_4_e5b1a622_for_u_ aStack_58;
  undefined4 uStack_4c;
  anon_union_8_4_e5b1a622_for_u_ aStack_48;
  undefined4 uStack_3c;
  anon_union_8_4_e5b1a622_for_u_ aStack_38;
  
  if (FLAGS_tcmalloc_transfer_num_objects == 0) {
    pcVar11 = TCMallocGetenvSafe("TCMALLOC_TRANSFER_NUM_OBJ");
    if (pcVar11 == (char *)0x0) {
      FLAGS_tcmalloc_transfer_num_objects = 0x20;
    }
    else {
      lVar12 = strtol(pcVar11,(char **)0x0,10);
      FLAGS_tcmalloc_transfer_num_objects = (int)lVar12;
    }
  }
  pcVar11 = TCMallocGetenvSafe("TCMALLOC_OVERRIDE_PAGESIZE");
  iVar8 = getpagesize();
  if (pcVar11 == (char *)0x0) {
    aVar13 = (anon_union_8_4_e5b1a622_for_u_)(long)iVar8;
  }
  else {
    aVar13.snum = strtoll(pcVar11,(char **)0x0,10);
  }
  aVar20.snum = 0x2000;
  if ((char *)0x2000 < aVar13.str) {
    aVar20 = aVar13;
  }
  if ((aVar20.unum & 0x1fff) != 0 && (char *)0x2000 < aVar13.str) {
    d._4_4_ = uStack_fc;
    d.tag_ = 2;
    b._4_4_ = uStack_11c;
    b.tag_ = 2;
    b.u_.str = aVar13.str;
    auVar6._4_8_ = ", malloc: ";
    auVar6._0_4_ = uStack_10c;
    auVar6._12_4_ = 0;
    d.u_.snum = 0x2000;
    Log(kLog,"/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
        ,0x95,(LogItem)(ZEXT816(0x133d49) << 0x40),b,(LogItem)(auVar6 << 0x20),d);
    aVar20.snum = 0x2000;
  }
  this->min_span_size_in_pages_ = aVar20.unum >> 0xd;
  iVar8 = FLAGS_tcmalloc_transfer_num_objects;
  uVar18 = 8;
  uVar17 = 1;
  do {
    if (uVar18 < 0x80) {
      uVar14 = (uint)(0xf < uVar18) * 8 + 8;
    }
    else {
      iVar15 = 4;
      iVar9 = 0;
      uVar16 = uVar18;
      do {
        iVar19 = 1 << ((byte)iVar15 & 0x1f);
        uVar21 = uVar16 >> ((byte)iVar19 & 0x3f);
        iVar41 = 0;
        if (uVar21 != 0) {
          uVar16 = uVar21;
          iVar41 = iVar19;
        }
        iVar9 = iVar9 + iVar41;
        bVar22 = iVar15 != 0;
        iVar15 = iVar15 + -1;
      } while (bVar22);
      iVar15 = 1 << ((byte)iVar9 & 0x1f);
      iVar9 = iVar15 + 7;
      if (-1 < iVar15) {
        iVar9 = iVar15;
      }
      uVar14 = iVar9 >> 3;
    }
    uVar10 = 0x2000;
    if (uVar14 < 0x2000) {
      uVar10 = uVar14;
    }
    if (uVar14 < 0x10 && 0xf < uVar18) {
      d_04._4_4_ = uStack_3c;
      d_04.tag_ = 4;
      c_03._4_4_ = uStack_4c;
      c_03.tag_ = 4;
      b_04._4_4_ = uStack_5c;
      b_04.tag_ = 4;
      b_04.u_.str = aStack_58.str;
      c_03.u_.str = aStack_48.str;
      d_04.u_.str = aStack_38.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0x66,(LogItem)(ZEXT816(0x133efc) << 0x40),b_04,c_03,d_04);
      do {
      } while( true );
    }
    if ((uVar10 & uVar10 - 1) != 0) {
      d_05._4_4_ = uStack_3c;
      d_05.tag_ = 4;
      c_04._4_4_ = uStack_4c;
      c_04.tag_ = 4;
      b_05._4_4_ = uStack_5c;
      b_05.tag_ = 4;
      b_05.u_.str = aStack_58.str;
      c_04.u_.str = aStack_48.str;
      d_05.u_.str = aStack_38.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0x67,(LogItem)(ZEXT816(0x133f27) << 0x40),b_05,c_04,d_05);
      do {
      } while( true );
    }
    if (uVar18 % (ulong)uVar10 != 0) {
      d_06._4_4_ = uStack_18c;
      d_06.tag_ = 4;
      c_05._4_4_ = uStack_19c;
      c_05.tag_ = 4;
      b_06._4_4_ = uStack_1ac;
      b_06.tag_ = 4;
      b_06.u_.str = aStack_1a8.str;
      c_05.u_.str = aStack_198.str;
      d_06.u_.str = aStack_188.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0xae,(LogItem)(ZEXT816(0x133e09) << 0x40),b_06,c_05,d_06);
      do {
      } while( true );
    }
    iVar9 = (int)(65536.0 / (double)(long)uVar18);
    if (iVar9 < 3) {
      iVar9 = 2;
    }
    if (iVar8 <= iVar9) {
      iVar9 = iVar8;
    }
    iVar15 = iVar9 + 3;
    if (-1 < iVar9) {
      iVar15 = iVar9;
    }
    pcVar11 = (char *)0x0;
    do {
      do {
        pcVar11 = pcVar11 + aVar20.str;
      } while ((ulong)pcVar11 >> 3 < (ulong)pcVar11 % uVar18);
    } while ((ulong)pcVar11 / uVar18 < (ulong)(long)(iVar15 >> 2));
    if ((((int)uVar17 < 2) ||
        (uVar14 = uVar17 - 1, (ulong)pcVar11 >> 0xd != this->class_to_pages_[uVar14])) ||
       (((ulong)pcVar11 & 0xffffffffffffe000) / uVar18 !=
        ((ulong)pcVar11 & 0xffffffffffffe000) / (ulong)(long)this->class_to_size_[uVar14])) {
      this->class_to_pages_[(int)uVar17] = (ulong)pcVar11 >> 0xd;
      this->class_to_size_[(int)uVar17] = (int32_t)uVar18;
      uVar17 = uVar17 + 1;
    }
    else {
      this->class_to_size_[uVar14] = (int32_t)uVar18;
    }
    uVar18 = uVar18 + uVar10;
  } while (uVar18 < 0x40001);
  aVar13 = (anon_union_8_4_e5b1a622_for_u_)(long)(int)uVar17;
  this->num_size_classes = (size_t)aVar13;
  if (0x80 < uVar17) {
    d_00._4_4_ = uStack_17c;
    d_00.tag_ = 4;
    c._4_4_ = uStack_dc;
    c.tag_ = 2;
    b_00._4_4_ = uStack_ec;
    b_00.tag_ = 1;
    b_00.u_.str = aVar13.str;
    c.u_.snum = 0x80;
    d_00.u_.str = aStack_178.str;
    Log(kCrash,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",0xd3
        ,(LogItem)(ZEXT816(0x133e21) << 0x40),b_00,c,d_00);
    aVar13 = (anon_union_8_4_e5b1a622_for_u_)this->num_size_classes;
  }
  auVar42 = _DAT_00133cb0;
  auVar6 = _DAT_001320b0;
  if ((char *)0x1 < aVar13.str) {
    uVar17 = 0;
    pcVar11 = (char *)0x1;
    do {
      iVar8 = this->class_to_size_[(long)pcVar11];
      if ((int)uVar17 <= iVar8) {
        iVar9 = iVar8 + 1;
        if (iVar8 + 1 < (int)(uVar17 + 8)) {
          iVar9 = uVar17 + 8;
        }
        uVar14 = ~uVar17 + iVar9;
        auVar40._0_4_ = uVar17 + 0x60;
        auVar40._4_4_ = uVar17 + 0x68;
        auVar40._8_4_ = uVar17 + 0x70;
        auVar40._12_4_ = uVar17 + 0x78;
        auVar59._0_4_ = uVar17 + 0x40;
        auVar59._4_4_ = uVar17 + 0x48;
        auVar59._8_4_ = uVar17 + 0x50;
        auVar59._12_4_ = uVar17 + 0x58;
        auVar81._0_4_ = uVar17 + 0x20;
        auVar81._4_4_ = uVar17 + 0x28;
        auVar81._8_4_ = uVar17 + 0x30;
        auVar81._12_4_ = uVar17 + 0x38;
        auVar46._4_4_ = uVar17 + 8;
        auVar46._0_4_ = uVar17;
        auVar46._8_4_ = uVar17 + 0x10;
        auVar46._12_4_ = uVar17 + 0x18;
        auVar43._0_4_ = uVar14 >> 3;
        auVar43._4_4_ = uVar14 >> 3;
        auVar43._8_4_ = uVar14 >> 3;
        auVar43._12_4_ = uVar14 >> 3;
        uVar17 = 0;
        auVar43 = auVar43 | auVar6;
        do {
          auVar51._4_4_ = uVar17;
          auVar51._0_4_ = uVar17;
          auVar51._8_4_ = uVar17;
          auVar51._12_4_ = uVar17;
          auVar44 = (auVar51 | _DAT_00133c70) ^ auVar6;
          iVar23 = auVar43._0_4_;
          auVar45._0_4_ = -(uint)(iVar23 < auVar44._0_4_);
          iVar24 = auVar43._4_4_;
          auVar45._4_4_ = -(uint)(iVar24 < auVar44._4_4_);
          iVar25 = auVar43._8_4_;
          auVar45._8_4_ = -(uint)(iVar25 < auVar44._8_4_);
          iVar26 = auVar43._12_4_;
          auVar45._12_4_ = -(uint)(iVar26 < auVar44._12_4_);
          iVar9 = auVar46._0_4_;
          iVar15 = auVar46._4_4_;
          iVar41 = auVar46._8_4_;
          iVar19 = auVar46._12_4_;
          auVar44._0_8_ = auVar46._0_8_;
          auVar44._8_4_ = iVar15;
          auVar44._12_4_ = -(uint)(iVar15 < 0);
          lVar12 = CONCAT44(-(uint)(iVar9 < 0),iVar9);
          auVar63 = auVar46 ^ auVar6;
          auVar53._0_4_ = -(uint)(-0x7ffffc00 < auVar63._0_4_);
          auVar53._4_4_ = -(uint)(-0x7ffffc00 < auVar63._4_4_);
          auVar53._8_4_ = -(uint)(-0x7ffffc00 < auVar63._8_4_);
          auVar53._12_4_ = -(uint)(-0x7ffffc00 < auVar63._12_4_);
          auVar53 = ~auVar45 & auVar53;
          auVar54._12_4_ = auVar53._12_4_;
          auVar64._4_4_ = auVar53._0_4_;
          auVar64._0_4_ = auVar53._0_4_;
          auVar64._8_4_ = auVar53._4_4_;
          auVar64._12_4_ = auVar53._4_4_;
          auVar71._0_8_ = lVar12 + 0x3c7fU >> 7;
          auVar71._8_8_ = auVar44._8_8_ + 0x3c7fU >> 7;
          auVar63._0_8_ = lVar12 + 7U >> 3;
          auVar63._8_8_ = auVar44._8_8_ + 7U >> 3;
          auVar44 = ~auVar64 & auVar63 | auVar71 & auVar42 & auVar64;
          uVar7 = (uchar)pcVar11;
          if ((~auVar45._0_4_ & 1) != 0) {
            this->class_array_[auVar44._0_8_] = uVar7;
          }
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          if ((SUB168(auVar45 ^ auVar2,0) >> 0x20 & 1) != 0) {
            this->class_array_[auVar44._8_8_] = uVar7;
          }
          auVar28._0_8_ = auVar46._8_8_;
          auVar28._8_4_ = iVar19;
          auVar28._12_4_ = -(uint)(iVar19 < 0);
          auVar54._4_4_ = auVar53._8_4_;
          auVar54._0_4_ = auVar53._8_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar46 = (auVar45 ^ auVar2) >> 0x30;
          auVar46 = packsswb(auVar46,auVar46);
          if ((auVar46._0_4_ >> 0x18 & 1) != 0) {
            this->class_array_
            [~auVar54._8_8_ & auVar28._8_8_ + 7U >> 3 |
             auVar28._8_8_ + 0x3c7fU >> 7 & auVar42._8_8_ & auVar54._8_8_] = uVar7;
          }
          auVar46 = (auVar51 | _DAT_00133c60) ^ auVar6;
          auVar47._0_4_ = -(uint)(iVar23 < auVar46._0_4_);
          auVar47._4_4_ = -(uint)(iVar24 < auVar46._4_4_);
          auVar47._8_4_ = -(uint)(iVar25 < auVar46._8_4_);
          auVar47._12_4_ = -(uint)(iVar26 < auVar46._12_4_);
          iVar80 = auVar81._0_4_;
          iVar82 = auVar81._4_4_;
          iVar83 = auVar81._8_4_;
          iVar84 = auVar81._12_4_;
          auVar72._0_8_ = auVar81._0_8_;
          auVar72._8_4_ = iVar82;
          auVar72._12_4_ = -(uint)(iVar82 < 0);
          lVar12 = CONCAT44(-(uint)(iVar80 < 0),iVar80);
          auVar46 = auVar81 ^ auVar6;
          auVar55._0_4_ = -(uint)(-0x7ffffc00 < auVar46._0_4_);
          auVar55._4_4_ = -(uint)(-0x7ffffc00 < auVar46._4_4_);
          auVar55._8_4_ = -(uint)(-0x7ffffc00 < auVar46._8_4_);
          auVar55._12_4_ = -(uint)(-0x7ffffc00 < auVar46._12_4_);
          auVar55 = ~auVar47 & auVar55;
          auVar56._12_4_ = auVar55._12_4_;
          auVar65._4_4_ = auVar55._0_4_;
          auVar65._0_4_ = auVar55._0_4_;
          auVar65._8_4_ = auVar55._4_4_;
          auVar65._12_4_ = auVar55._4_4_;
          auVar29._0_8_ = lVar12 + 0x3c7fU >> 7;
          auVar29._8_8_ = auVar72._8_8_ + 0x3c7fU >> 7;
          auVar73._0_8_ = lVar12 + 7U >> 3;
          auVar73._8_8_ = auVar72._8_8_ + 7U >> 3;
          auVar46 = ~auVar65 & auVar73 | auVar29 & auVar42 & auVar65;
          if ((((ushort)auVar47._0_4_ ^ 0xffff) & 1) != 0) {
            this->class_array_[auVar46._0_8_] = uVar7;
          }
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar47 = auVar47 ^ auVar3;
          auVar30._0_8_ = auVar47._0_8_ << 0x30;
          auVar30._8_8_ = auVar47._8_8_ << 0x30 | auVar47._0_8_ >> 0x10;
          auVar44 = packsswb(auVar30,auVar30);
          if ((auVar44._4_2_ >> 8 & 1) != 0) {
            this->class_array_[auVar46._8_8_] = uVar7;
          }
          auVar31._0_8_ = auVar81._8_8_;
          auVar31._8_4_ = iVar84;
          auVar31._12_4_ = -(uint)(iVar84 < 0);
          lVar12 = CONCAT44(-(uint)(iVar83 < 0),iVar83);
          auVar56._4_4_ = auVar55._8_4_;
          auVar56._0_4_ = auVar55._8_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar66._0_8_ = lVar12 + 0x3c7fU >> 7;
          auVar66._8_8_ = auVar31._8_8_ + 0x3c7fU >> 7;
          auVar32._0_8_ = lVar12 + 7U >> 3;
          auVar32._8_8_ = auVar31._8_8_ + 7U >> 3;
          auVar46 = ~auVar56 & auVar32 | auVar66 & auVar42 & auVar56;
          if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            this->class_array_[auVar46._0_8_] = uVar7;
          }
          if ((auVar47._11_2_ >> 8 & 1) != 0) {
            this->class_array_[auVar46._8_8_] = uVar7;
          }
          auVar46 = (auVar51 | _DAT_00133c50) ^ auVar6;
          auVar48._0_4_ = -(uint)(iVar23 < auVar46._0_4_);
          auVar48._4_4_ = -(uint)(iVar24 < auVar46._4_4_);
          auVar48._8_4_ = -(uint)(iVar25 < auVar46._8_4_);
          auVar48._12_4_ = -(uint)(iVar26 < auVar46._12_4_);
          iVar76 = auVar59._0_4_;
          iVar77 = auVar59._4_4_;
          iVar78 = auVar59._8_4_;
          iVar79 = auVar59._12_4_;
          auVar67._0_8_ = auVar59._0_8_;
          auVar67._8_4_ = iVar77;
          auVar67._12_4_ = -(uint)(iVar77 < 0);
          lVar12 = CONCAT44(-(uint)(iVar76 < 0),iVar76);
          auVar46 = auVar59 ^ auVar6;
          auVar57._0_4_ = -(uint)(-0x7ffffc00 < auVar46._0_4_);
          auVar57._4_4_ = -(uint)(-0x7ffffc00 < auVar46._4_4_);
          auVar57._8_4_ = -(uint)(-0x7ffffc00 < auVar46._8_4_);
          auVar57._12_4_ = -(uint)(-0x7ffffc00 < auVar46._12_4_);
          auVar57 = ~auVar48 & auVar57;
          auVar58._12_4_ = auVar57._12_4_;
          auVar74._4_4_ = auVar57._0_4_;
          auVar74._0_4_ = auVar57._0_4_;
          auVar74._8_4_ = auVar57._4_4_;
          auVar74._12_4_ = auVar57._4_4_;
          auVar33._0_8_ = lVar12 + 0x3c7fU >> 7;
          auVar33._8_8_ = auVar67._8_8_ + 0x3c7fU >> 7;
          auVar68._0_8_ = lVar12 + 7U >> 3;
          auVar68._8_8_ = auVar67._8_8_ + 7U >> 3;
          auVar46 = ~auVar74 & auVar68 | auVar33 & auVar42 & auVar74;
          if ((((ushort)auVar48._0_4_ ^ 0xffff) & 1) != 0) {
            this->class_array_[auVar46._0_8_] = uVar7;
          }
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          if ((SUB162(auVar48 ^ auVar4,3) >> 8 & 1) != 0) {
            this->class_array_[auVar46._8_8_] = uVar7;
          }
          auVar34._0_8_ = auVar59._8_8_;
          auVar34._8_4_ = iVar79;
          auVar34._12_4_ = -(uint)(iVar79 < 0);
          lVar12 = CONCAT44(-(uint)(iVar78 < 0),iVar78);
          auVar58._4_4_ = auVar57._8_4_;
          auVar58._0_4_ = auVar57._8_4_;
          auVar58._8_4_ = auVar58._12_4_;
          auVar75._0_8_ = lVar12 + 0x3c7fU >> 7;
          auVar75._8_8_ = auVar34._8_8_ + 0x3c7fU >> 7;
          auVar35._0_8_ = lVar12 + 7U >> 3;
          auVar35._8_8_ = auVar34._8_8_ + 7U >> 3;
          auVar59 = ~auVar58 & auVar35 | auVar75 & auVar42 & auVar58;
          auVar46 = pshufhw(auVar35,auVar48,0);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          if (((auVar46 ^ auVar5) & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            this->class_array_[auVar59._0_8_] = uVar7;
          }
          auVar46 = packsswb(auVar46 ^ auVar5,(auVar48 ^ auVar4) >> 0x30);
          if ((auVar46._10_2_ >> 8 & 1) != 0) {
            this->class_array_[auVar59._8_8_] = uVar7;
          }
          auVar46 = (auVar51 | _DAT_00133c40) ^ auVar6;
          auVar52._0_4_ = -(uint)(iVar23 < auVar46._0_4_);
          auVar52._4_4_ = -(uint)(iVar24 < auVar46._4_4_);
          auVar52._8_4_ = -(uint)(iVar25 < auVar46._8_4_);
          auVar52._12_4_ = -(uint)(iVar26 < auVar46._12_4_);
          iVar23 = auVar40._0_4_;
          iVar24 = auVar40._4_4_;
          iVar25 = auVar40._8_4_;
          iVar26 = auVar40._12_4_;
          auVar60._0_8_ = auVar40._0_8_;
          auVar60._8_4_ = iVar24;
          auVar60._12_4_ = -(uint)(iVar24 < 0);
          lVar12 = CONCAT44(-(uint)(iVar23 < 0),iVar23);
          auVar46 = auVar40 ^ auVar6;
          auVar49._0_4_ = -(uint)(-0x7ffffc00 < auVar46._0_4_);
          auVar49._4_4_ = -(uint)(-0x7ffffc00 < auVar46._4_4_);
          auVar49._8_4_ = -(uint)(-0x7ffffc00 < auVar46._8_4_);
          auVar49._12_4_ = -(uint)(-0x7ffffc00 < auVar46._12_4_);
          auVar49 = ~auVar52 & auVar49;
          auVar50._12_4_ = auVar49._12_4_;
          auVar69._4_4_ = auVar49._0_4_;
          auVar69._0_4_ = auVar49._0_4_;
          auVar69._8_4_ = auVar49._4_4_;
          auVar69._12_4_ = auVar49._4_4_;
          auVar36._0_8_ = lVar12 + 0x3c7fU >> 7;
          auVar36._8_8_ = auVar60._8_8_ + 0x3c7fU >> 7;
          auVar61._0_8_ = lVar12 + 7U >> 3;
          auVar61._8_8_ = auVar60._8_8_ + 7U >> 3;
          auVar46 = ~auVar69 & auVar61 | auVar36 & auVar42 & auVar69;
          if ((((ushort)auVar52._0_4_ ^ 0xffff) & 1) != 0) {
            this->class_array_[auVar46._0_8_] = uVar7;
          }
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar62 = auVar52 ^ auVar62;
          auVar37._0_8_ = auVar62._0_8_ << 0x30;
          auVar37._8_8_ = auVar62._8_8_ << 0x30 | auVar62._0_8_ >> 0x10;
          auVar59 = packsswb(auVar37,auVar37);
          if ((auVar59._12_2_ >> 8 & 1) != 0) {
            this->class_array_[auVar46._8_8_] = uVar7;
          }
          auVar38._0_8_ = auVar40._8_8_;
          auVar38._8_4_ = iVar26;
          auVar38._12_4_ = -(uint)(iVar26 < 0);
          lVar12 = CONCAT44(-(uint)(iVar25 < 0),iVar25);
          auVar50._4_4_ = auVar49._8_4_;
          auVar50._0_4_ = auVar49._8_4_;
          auVar50._8_4_ = auVar50._12_4_;
          auVar70._0_8_ = lVar12 + 0x3c7fU >> 7;
          auVar70._8_8_ = auVar38._8_8_ + 0x3c7fU >> 7;
          auVar39._0_8_ = lVar12 + 7U >> 3;
          auVar39._8_8_ = auVar38._8_8_ + 7U >> 3;
          auVar46 = ~auVar50 & auVar39 | auVar70 & auVar42 & auVar50;
          auVar40 = pshufhw(auVar39,auVar52,0);
          if (((auVar40._14_2_ ^ 0xffff) & 1) != 0) {
            this->class_array_[auVar46._0_8_] = uVar7;
          }
          if ((auVar62._14_2_ >> 8 & 1) != 0) {
            this->class_array_[auVar46._8_8_] = uVar7;
          }
          uVar17 = uVar17 + 0x10;
          iVar27 = (int)DAT_00133cc0;
          auVar46._0_4_ = iVar9 + iVar27;
          iVar9 = DAT_00133cc0._4_4_;
          auVar46._4_4_ = iVar15 + iVar9;
          iVar15 = DAT_00133cc0._8_4_;
          auVar46._8_4_ = iVar41 + iVar15;
          iVar41 = DAT_00133cc0._12_4_;
          auVar46._12_4_ = iVar19 + iVar41;
          auVar81._0_4_ = iVar80 + iVar27;
          auVar81._4_4_ = iVar82 + iVar9;
          auVar81._8_4_ = iVar83 + iVar15;
          auVar81._12_4_ = iVar84 + iVar41;
          auVar59._0_4_ = iVar76 + iVar27;
          auVar59._4_4_ = iVar77 + iVar9;
          auVar59._8_4_ = iVar78 + iVar15;
          auVar59._12_4_ = iVar79 + iVar41;
          auVar40._0_4_ = iVar23 + iVar27;
          auVar40._4_4_ = iVar24 + iVar9;
          auVar40._8_4_ = iVar25 + iVar15;
          auVar40._12_4_ = iVar26 + iVar41;
        } while (((uVar14 >> 3) + 0x10 & 0xfffffff0) != uVar17);
        aVar13 = (anon_union_8_4_e5b1a622_for_u_)this->num_size_classes;
      }
      uVar17 = iVar8 + 8;
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 < aVar13.str);
  }
  aVar13.str = (char *)0x0;
  do {
    if ((ulong)aVar13 < (char *)0x401) {
      uVar18 = aVar13.unum >> 3;
    }
    else {
      uVar18 = aVar13.snum + 0x3c7fU >> 7;
    }
    bVar1 = this->class_array_[uVar18];
    uVar18 = (ulong)bVar1;
    if ((uVar18 == 0) || (this->num_size_classes <= uVar18)) {
      d_01._4_4_ = uStack_16c;
      d_01.tag_ = 4;
      c_00._4_4_ = uStack_bc;
      c_00.tag_ = 2;
      b_01._4_4_ = uStack_cc;
      b_01.tag_ = 1;
      b_01.u_.unum._0_1_ = bVar1;
      b_01.u_.snum._1_7_ = 0;
      c_00.u_.str = aVar13.str;
      d_01.u_.str = aStack_168.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0xe5,(LogItem)(ZEXT816(0x133e48) << 0x40),b_01,c_00,d_01);
    }
    if ((1 < bVar1) && (aVar13.str <= (char *)(long)this->class_to_size_[bVar1 - 1])) {
      d_02._4_4_ = uStack_15c;
      d_02.tag_ = 4;
      c_01._4_4_ = uStack_9c;
      c_01.tag_ = 2;
      b_02._4_4_ = uStack_ac;
      b_02.tag_ = 1;
      b_02.u_.unum._0_1_ = bVar1;
      b_02.u_.snum._1_7_ = 0;
      c_01.u_.str = aVar13.str;
      d_02.u_.str = aStack_158.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0xe9,(LogItem)(ZEXT816(0x133e65) << 0x40),b_02,c_01,d_02);
    }
    aVar20 = (anon_union_8_4_e5b1a622_for_u_)(long)this->class_to_size_[uVar18];
    if (aVar20.str == (char *)0x0 || aVar20.str < aVar13.str) {
      d_03._4_4_ = uStack_6c;
      d_03.tag_ = 2;
      c_02._4_4_ = uStack_7c;
      c_02.tag_ = 2;
      b_03._4_4_ = uStack_8c;
      b_03.tag_ = 1;
      b_03.u_.unum._0_1_ = bVar1;
      b_03.u_.snum._1_7_ = 0;
      c_02.u_.str = aVar20.str;
      d_03.u_.str = aVar13.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0xee,(LogItem)(ZEXT816(0x133e98) << 0x40),b_03,c_02,d_03);
    }
    iVar8 = FLAGS_tcmalloc_transfer_num_objects;
    aVar20.str = (char *)(aVar13.snum + 8);
    bVar22 = aVar13.str < (char *)0x401;
    aVar13.str = (char *)(aVar13.snum + 0x80);
    if (bVar22) {
      aVar13.str = aVar20.str;
    }
  } while (aVar13.str < (char *)0x40001);
  uVar18 = 0x10;
  do {
    if (0x1fff < uVar18) break;
    uVar16 = uVar18;
    do {
      if (uVar16 < 0x401) {
        uVar21 = uVar16 >> 3;
      }
      else {
        uVar21 = uVar16 + 0x3c7f >> 7;
      }
      if ((uVar18 - 1 & (long)this->class_to_size_[this->class_array_[uVar21]]) != 0) {
        d_07._4_4_ = uStack_12c;
        d_07.tag_ = 4;
        c_06._4_4_ = uStack_13c;
        c_06.tag_ = 4;
        b_07._4_4_ = uStack_14c;
        b_07.tag_ = 4;
        b_07.u_.str = aStack_148.str;
        c_06.u_.str = aStack_138.str;
        d_07.u_.str = aStack_128.str;
        Log(kCrash,
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
            0x103,(LogItem)(ZEXT816(0x133eb5) << 0x40),b_07,c_06,d_07);
        do {
        } while( true );
      }
      uVar16 = uVar16 + uVar18;
    } while (uVar16 < 0x2000);
    bVar22 = uVar18 < 0x1001;
    uVar18 = uVar18 * 2;
  } while (bVar22);
  uVar18 = this->num_size_classes;
  if (1 < uVar18) {
    lVar12 = 0;
    do {
      iVar9 = this->class_to_size_[(int)lVar12 + 1];
      iVar15 = 0;
      if ((long)iVar9 != 0) {
        auVar42._8_4_ = iVar9 >> 0x1f;
        auVar42._0_8_ = (long)iVar9;
        auVar42._12_4_ = 0x45300000;
        iVar15 = (int)(65536.0 /
                      ((auVar42._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar9) - 4503599627370496.0)));
        if (iVar15 < 3) {
          iVar15 = 2;
        }
        if (iVar8 <= iVar15) {
          iVar15 = iVar8;
        }
      }
      this->num_objects_to_move_[lVar12 + 1] = iVar15;
      lVar12 = lVar12 + 1;
    } while (uVar18 - 1 != lVar12);
  }
  return;
}

Assistant:

void SizeMap::Init() {
  InitTCMallocTransferNumObjects();

#if (!defined(_WIN32) || defined(TCMALLOC_BRAVE_EFFECTIVE_PAGE_SIZE)) && !defined(TCMALLOC_COWARD_EFFECTIVE_PAGE_SIZE)
  size_t native_page_size = tcmalloc::commandlineflags::StringToLongLong(
    TCMallocGetenvSafe("TCMALLOC_OVERRIDE_PAGESIZE"), getpagesize());
#else
  // So windows getpagesize() returns 64k. Because that is
  // "granularity size" w.r.t. their virtual memory facility. So kinda
  // maybe not a bad idea to also have effective logical pages at 64k
  // too. But it breaks frag_unittest (for mostly harmless
  // reason). And I am not brave enough to have our behavior change so
  // much on windows (which isn't that much; people routinely run 256k
  // logical pages anyways).
  constexpr size_t native_page_size = kPageSize;
#endif

  size_t min_span_size = std::max<size_t>(native_page_size, kPageSize);
  if (min_span_size > kPageSize && (min_span_size % kPageSize) != 0) {
    Log(kLog, __FILE__, __LINE__, "This should never happen, but somehow "
        "we got systems page size not power of 2 and not multiple of "
        "malloc's logical page size. Releasing memory back will mostly not happen. "
        "system: ", native_page_size, ", malloc: ", kPageSize);
    min_span_size = kPageSize;
  }

  min_span_size_in_pages_ = min_span_size / kPageSize;

  // Do some sanity checking on add_amount[]/shift_amount[]/class_array[]
  if (ClassIndex(0) != 0) {
    Log(kCrash, __FILE__, __LINE__,
        "Invalid class index for size 0", ClassIndex(0));
  }
  if (ClassIndex(kMaxSize) >= sizeof(class_array_)) {
    Log(kCrash, __FILE__, __LINE__,
        "Invalid class index for kMaxSize", ClassIndex(kMaxSize));
  }

  // Compute the size classes we want to use
  int sc = 1;   // Next size class to assign
  int alignment = kAlignment;
  CHECK_CONDITION(kAlignment <= kMinAlign);
  for (size_t size = kAlignment; size <= kMaxSize; size += alignment) {
    alignment = AlignmentForSize(size);
    CHECK_CONDITION((size % alignment) == 0);

    int blocks_to_move = NumMoveSize(size) / 4;
    size_t psize = 0;
    do {
      psize += min_span_size;
      // Allocate enough pages so leftover is less than 1/8 of total.
      // This bounds wasted space to at most 12.5%.
      while ((psize % size) > (psize >> 3)) {
        psize += min_span_size;
      }
      // Continue to add pages until there are at least as many objects in
      // the span as are needed when moving objects from the central
      // freelists and spans to the thread caches.
    } while ((psize / size) < (blocks_to_move));
    const size_t my_pages = psize >> kPageShift;

    if (sc > 1 && my_pages == class_to_pages_[sc-1]) {
      // See if we can merge this into the previous class without
      // increasing the fragmentation of the previous class.
      const size_t my_objects = (my_pages << kPageShift) / size;
      const size_t prev_objects = (class_to_pages_[sc-1] << kPageShift)
                                  / class_to_size_[sc-1];
      if (my_objects == prev_objects) {
        // Adjust last class to include this size
        class_to_size_[sc-1] = size;
        continue;
      }
    }

    // Add new class
    class_to_pages_[sc] = my_pages;
    class_to_size_[sc] = size;
    sc++;
  }
  num_size_classes = sc;
  if (sc > kClassSizesMax) {
    Log(kCrash, __FILE__, __LINE__,
        "too many size classes: (found vs. max)", sc, kClassSizesMax);
  }

  // Initialize the mapping arrays
  int next_size = 0;
  for (int c = 1; c < num_size_classes; c++) {
    const int max_size_in_class = class_to_size_[c];
    for (int s = next_size; s <= max_size_in_class; s += kAlignment) {
      class_array_[ClassIndex(s)] = c;
    }
    next_size = max_size_in_class + kAlignment;
  }

  // Double-check sizes just to be safe
  for (size_t size = 0; size <= kMaxSize;) {
    const int sc = SizeClass(size);
    if (sc <= 0 || sc >= num_size_classes) {
      Log(kCrash, __FILE__, __LINE__,
          "Bad size class (class, size)", sc, size);
    }
    if (sc > 1 && size <= class_to_size_[sc-1]) {
      Log(kCrash, __FILE__, __LINE__,
          "Allocating unnecessarily large class (class, size)", sc, size);
    }
    const size_t s = class_to_size_[sc];
    if (size > s || s == 0) {
      Log(kCrash, __FILE__, __LINE__,
          "Bad (class, size, requested)", sc, s, size);
    }
    if (size <= kMaxSmallSize) {
      size += 8;
    } else {
      size += 128;
    }
  }

  // Our fast-path aligned allocation functions rely on 'naturally
  // aligned' sizes to produce aligned addresses. Lets check if that
  // holds for size classes that we produced.
  //
  // I.e. we're checking that
  //
  // align = (1 << shift), malloc(i * align) % align == 0,
  //
  // for all align values up to kPageSize.
  for (size_t align = kMinAlign; align <= kPageSize; align <<= 1) {
    for (size_t size = align; size < kPageSize; size += align) {
      CHECK_CONDITION(class_to_size_[SizeClass(size)] % align == 0);
    }
  }

  // Initialize the num_objects_to_move array.
  for (size_t cl = 1; cl  < num_size_classes; ++cl) {
    num_objects_to_move_[cl] = NumMoveSize(ByteSizeForClass(cl));
  }
}